

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

int __thiscall
glcts::GeometryShaderRenderingPointsCase::verify
          (GeometryShaderRenderingPointsCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  ulong uVar6;
  TestError *this_00;
  byte bVar7;
  int iVar8;
  byte *pbVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  uint rt_width;
  int local_1dc;
  size_t local_1d8;
  undefined8 local_1d0;
  int local_1c8;
  uint rt_height;
  GeometryShaderRenderingPointsCase *local_1c0;
  byte *local_1b8;
  undefined1 local_1b0 [384];
  
  rt_height = 0;
  rt_width = 0;
  uVar12 = (uint)ctx;
  pp_Var5 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode;
  local_1d8 = siglen;
  if ((uVar12 & 0xfffffffd) == 1) {
    uVar2 = (*pp_Var5[5])(this);
    uVar11 = (ulong)uVar2;
    pp_Var5 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode;
  }
  else {
    uVar11 = 1;
  }
  (*pp_Var5[0xd])(this,uVar11,&rt_width,&rt_height);
  iVar10 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  iVar8 = (int)sig;
  if (iVar10 == 0) {
    iVar13 = iVar8 * 5 + 1;
    iVar8 = rt_width * iVar13;
    pbVar9 = this->m_unordered_elements_data;
    iVar10 = 1;
    lVar14 = 0;
    do {
      if (lVar14 == 0x20) {
        return iVar8;
      }
      if (uVar12 - 2 < 3) {
        bVar7 = *pbVar9;
        iVar18 = iVar8 + (uint)bVar7 + (uint)bVar7 * 4 + 1;
        lVar15 = (ulong)bVar7 * -4 + 0x1c;
        iVar4 = (uint)bVar7 + (uint)bVar7 * 4 + 1;
      }
      else {
        iVar18 = iVar8 + iVar10;
        lVar15 = lVar14;
        iVar4 = iVar10;
      }
      iVar10 = iVar10 + 5;
      lVar14 = lVar14 + 4;
      pbVar9 = pbVar9 + 1;
    } while (*(int *)(local_1d8 + (uint)(iVar18 << 2)) == *(int *)(verify::ref_data + lVar15));
    local_1b0._0_8_ =
         ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode
         .m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reference data: [");
    std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar15]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar15 + 1]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar15 + 2]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar15 + 3]);
    std::operator<<((ostream *)poVar1,"] for pixel at (");
    std::ostream::operator<<(poVar1,iVar4);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,iVar13);
    std::operator<<((ostream *)poVar1,") does not match  [");
    pbVar9 = (byte *)(local_1d8 + (uint)(iVar18 << 2));
    std::ostream::operator<<(poVar1,(uint)*pbVar9);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,(uint)pbVar9[1]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,(uint)pbVar9[2]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,(uint)pbVar9[3]);
    std::operator<<((ostream *)poVar1,").");
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Data comparison failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x748);
  }
  else {
    if (iVar10 == 1) {
      local_1b8 = this->m_unordered_elements_data;
      local_1dc = iVar8 * 7;
      local_1c8 = rt_width * 4;
      local_1d0 = 0;
      iVar13 = 0;
      iVar8 = 1;
      iVar10 = 1;
      do {
        uVar2 = 0;
        lVar14 = 0;
        if (1 < uVar12) {
          uVar2 = (uint)*local_1b8;
          lVar14 = 0x1c - (ulong)((uint)*local_1b8 * 4);
        }
        iVar21 = local_1dc + 1;
        iVar16 = uVar2 * 7 + iVar8;
        iVar18 = uVar2 * 0x1c + iVar8 * 4;
        iVar4 = local_1c8 * iVar21;
        iVar8 = 5;
        while (bVar22 = iVar8 != 0, iVar8 = iVar8 + -1, bVar22) {
          lVar15 = (long)iVar4 + local_1d8;
          if (*(int *)(iVar18 + lVar15) != *(int *)(verify::ref_data + lVar14)) {
            local_1b0._0_8_ =
                 ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            local_1c0 = this;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"At            (");
            std::ostream::operator<<(poVar1,iVar16);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,iVar21);
            std::operator<<((ostream *)poVar1,"), rendered data (");
            pbVar9 = (byte *)(lVar15 + iVar18);
            std::ostream::operator<<(poVar1,(uint)*pbVar9);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,(uint)pbVar9[1]);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,(uint)pbVar9[2]);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,(uint)pbVar9[3]);
            std::operator<<((ostream *)poVar1,") is different from reference data (");
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14]);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14 + 1]);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14 + 2]);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14 + 3]);
            std::operator<<((ostream *)poVar1,")");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Data comparison failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                       ,0x70d);
            goto LAB_00cf549f;
          }
          iVar21 = iVar21 + iVar13;
          iVar16 = iVar16 + iVar10;
          iVar18 = iVar18 + iVar10 * 4;
          iVar4 = iVar4 + local_1c8 * iVar13;
        }
        iVar13 = iVar13 + 1;
        iVar8 = 5;
        iVar10 = 0;
      } while( true );
    }
    if (iVar10 == 2) {
      iVar10 = iVar8 * 0xc + 6;
      iVar13 = (iVar8 * 6 + iVar10 + 6) / 3;
      uVar11 = (long)(iVar10 + iVar8 * 6) / 3;
      uVar6 = uVar11 & 0xffffffff;
      local_1d0 = CONCAT44(local_1d0._4_4_,iVar13);
      lVar20 = iVar13 * rt_width * 4 + local_1d8;
      local_1dc = (int)uVar11;
      lVar17 = rt_width * 4 * local_1dc + local_1d8;
      lVar14 = 0;
      lVar15 = 0;
      while( true ) {
        if (lVar14 == 0x20) {
          return (int)uVar6;
        }
        if (uVar12 - 2 < 3) {
          uVar2 = (uint)this->m_unordered_elements_data[lVar15];
          lVar19 = 0x1c - (ulong)((uint)this->m_unordered_elements_data[lVar15] * 4);
        }
        else {
          uVar2 = (uint)lVar15;
          lVar19 = lVar14;
        }
        uVar3 = (uVar2 * 0x12 + 6 & 0xffff) / 3;
        uVar2 = (uVar2 * 0x12 + 0xc & 0xffff) / 3;
        uVar11 = (ulong)(ushort)uVar3;
        bVar7 = verify::ref_data_triangle_strip[lVar19];
        iVar8 = (uint)*(byte *)(lVar20 + uVar11 * 4) - (uint)bVar7;
        iVar10 = -iVar8;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        if ((((1 < (byte)iVar10) || (*(char *)(lVar20 + 1 + uVar11 * 4) != '\0')) ||
            (*(char *)(lVar20 + 2 + uVar11 * 4) != '\0')) ||
           (*(char *)(lVar20 + 3 + uVar11 * 4) != '\0')) {
          local_1b0._0_8_ =
               ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"At (");
          std::ostream::operator<<(poVar1,uVar3);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(int)local_1d0);
          std::operator<<((ostream *)poVar1,") ");
          std::operator<<((ostream *)poVar1,"rendered pixel (");
          std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + uVar11 * 4));
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + 1 + uVar11 * 4));
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + 2 + uVar11 * 4));
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + 3 + uVar11 * 4));
          std::operator<<((ostream *)poVar1,") ");
          std::operator<<((ostream *)poVar1,"is different than (");
          std::ostream::operator<<(poVar1,(uint)bVar7);
          std::operator<<((ostream *)poVar1,", 0, 0, 0).");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Data comparison failed.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x79a);
          goto LAB_00cf549f;
        }
        uVar11 = (ulong)(ushort)uVar2;
        if (*(char *)(lVar17 + uVar11 * 4) != '\0') break;
        uVar3 = (uint)*(byte *)(lVar17 + 1 + uVar11 * 4) -
                (uint)verify::ref_data_triangle_strip[lVar19 + 1];
        uVar6 = (ulong)uVar3;
        bVar7 = -(byte)uVar3;
        if (0 < (int)uVar3) {
          bVar7 = (byte)uVar3;
        }
        if ((1 < bVar7) || (*(char *)(lVar17 + 2 + uVar11 * 4) != '\0')) break;
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 4;
        if (*(char *)(lVar17 + 3 + uVar11 * 4) != '\0') break;
      }
      local_1b0._0_8_ =
           ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"At (");
      std::ostream::operator<<(poVar1,uVar2);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,local_1dc);
      std::operator<<((ostream *)poVar1,") ");
      std::operator<<((ostream *)poVar1,"rendered pixel (");
      std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar17 + uVar11 * 4));
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar17 + 1 + uVar11 * 4));
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar17 + 2 + uVar11 * 4));
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar17 + 3 + uVar11 * 4));
      std::operator<<((ostream *)poVar1,") ");
      std::operator<<((ostream *)poVar1,"is different than (0, ");
      std::ostream::operator<<(poVar1,(uint)verify::ref_data_triangle_strip[lVar19 + 1]);
      std::operator<<((ostream *)poVar1,", 0, 0).");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Data comparison failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x7ac);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported output layout qualifier requested.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x7b5);
    }
  }
LAB_00cf549f:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderRenderingPointsCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											   const unsigned char* data)
{
	/* The array is directly related to vertex shader contents for "points" and "line_strip"
	 * outputs */
	static const unsigned char ref_data[] = { 255, 0, 0, 0,   0,   255, 0,   0, 0,   0,   255, 0,
											  0,   0, 0, 255, 255, 255, 0,   0, 255, 0,   255, 0,
											  255, 0, 0, 255, 255, 255, 255, 0, 255, 255, 0,   255 };
	/* The array refers to colors as defined in vertex shader used for "triangle_strip"
	 * output.
	 */
	static const unsigned char ref_data_triangle_strip[] = {
		(unsigned char)(0.1f * 255), (unsigned char)(0.8f * 255), 0,   0,
		(unsigned char)(0.2f * 255), (unsigned char)(0.7f * 255), 0,   0,
		(unsigned char)(0.3f * 255), (unsigned char)(0.6f * 255), 255, 0,
		(unsigned char)(0.4f * 255), (unsigned char)(0.5f * 255), 0,   255,
		(unsigned char)(0.5f * 255), (unsigned char)(0.4f * 255), 0,   0,
		(unsigned char)(0.6f * 255), (unsigned char)(0.3f * 255), 255, 0,
		(unsigned char)(0.7f * 255), (unsigned char)(0.2f * 255), 0,   255,
		(unsigned char)(0.8f * 255), (unsigned char)(0.1f * 255), 255, 0
	};
	unsigned int rt_height = 0;
	unsigned int rt_width  = 0;

	/* Retrieve render-target size */
	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
		{
			/* Each point takes a 7x7 block. The test should verify that the second "nested" block
			 * is of the valid color. Blocks can be built on top of each other if instanced draw
			 * calls are used. */
			const unsigned char* reference_data		   = NULL;
			const unsigned char* rendered_data		   = NULL;
			const int			 row_width			   = rt_width * 4 /* components */;
			const int			 sample_region_edge_px = 5 /* pixels */;

			for (int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
			{
				/* Edge 1: TL->TR
				 * Edge 2: TR->BR
				 * Edge 3: BR->BL
				 * Edge 4: BL->TL
				 */
				int dx		= 0;
				int dy		= 0;
				int x		= 0;
				int x_start = 0;
				int y		= 0;
				int y_start = 0;

				switch (n_edge)
				{
				/* NOTE: The numbers here are as per test spec */
				case 0:
					dx		= 1 /* px */;
					dy		= 0 /* px */;
					x_start = 1 /* px */;
					y_start = 1 /* px */;
					break;
				case 1:
					dx		= 0 /* px */;
					dy		= 1 /* px */;
					x_start = 5 /* px */;
					y_start = 1 /* px */;
					break;
				case 2:
					dx		= -1 /* px */;
					dy		= 0 /* px */;
					x_start = 5 /* px */;
					y_start = 5 /* px */;
					break;
				case 3:
					dx		= 0 /* px */;
					dy		= -1 /* px */;
					x_start = 1 /* px */;
					y_start = 5 /* px */;
					break;

				default:
				{
					TCU_FAIL("Invalid edge index");
				}
				} /* switch (n_edge) */

				/* What color should the pixels have? */
				if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS ||
					drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED)
				{
					reference_data = ref_data + n_point * 4 /* components */;
					x			   = x_start + n_point * 7 /* pixel block size */;
					y			   = y_start + instance_id * 7 /* pixel block size */;
				}
				else
				{
					int index = m_unordered_elements_data[n_point];

					reference_data = ref_data + (8 - 1 - index) * 4 /* components */;
					x			   = x_start + index * 7 /* pixel block size */;
					y			   = y_start + instance_id * 7 /* pixel block size */;
				}

				/* Verify edge pixels */
				for (int n_pixel = 0; n_pixel < sample_region_edge_px; ++n_pixel)
				{
					rendered_data = data + y * row_width + x * 4 /* components */;

					if (memcmp(rendered_data, reference_data, 4 /* components */) != 0)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "At            (" << (int)x << ", " << (int)y
										   << "), "
											  "rendered data ("
										   << (int)rendered_data[0] << ", " << (int)rendered_data[1] << ", "
										   << (int)rendered_data[2] << ", " << (int)rendered_data[3]
										   << ") "
											  "is different from reference data ("
										   << (int)reference_data[0] << ", " << (int)reference_data[1] << ", "
										   << (int)reference_data[2] << ", " << (int)reference_data[3] << ")"
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Data comparison failed");
					} /* if (data comparison failed) */

					/* Move to next pixel */
					x += dx;
					y += dy;
				} /* for (all pixels) */
			}	 /* for (all edges) */
		}		  /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* For each 3px high row, we want to sample the second row. Area of a single "pixel" (incl. delta)
		 * can take no more than 5px, with the actual sampled area located in the second pixel.
		 */
		const int sample_region_width_px = 5; /* pixels */

		for (int n = 0; n < 8 /* points */; ++n)
		{
			int					 x				= 0;
			int					 y				= 0;
			const unsigned char* reference_data = NULL;
			const unsigned char* rendered_data  = NULL;

			/* Different ordering is used for indexed draw calls */
			if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
			{
				/* For indexed calls, vertex data is laid out in a reversed ordered */
				int index = m_unordered_elements_data[n];

				x			   = index * sample_region_width_px + 1;
				y			   = instance_id * 5 + 1; /* middle row */
				reference_data = ref_data + ((8 - 1 - index) * 4 /* components */);
				rendered_data  = data + (y * rt_width + x) * 4 /* components */;
			} /* if (draw call is indiced) */
			else
			{
				x			   = n * sample_region_width_px + 1;
				y			   = instance_id * 5 + 1; /* middle row */
				reference_data = ref_data + (n * 4 /* components */);
				rendered_data  = data + (y * rt_width + x) * 4 /* components */;
			}

			if (memcmp(rendered_data, reference_data, 4 /* components */) != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Reference data: [" << (int)reference_data[0] << ", "
								   << (int)reference_data[1] << ", " << (int)reference_data[2] << ", "
								   << (int)reference_data[3] << "] "
																"for pixel at ("
								   << x << ", " << y << ") "
														"does not match  ["
								   << (int)rendered_data[0] << ", " << (int)rendered_data[1] << ", "
								   << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ").";

				TCU_FAIL("Data comparison failed.");
			} /* if (memcmp(rendered_data, reference_data, 4) != 0) */
		}	 /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* A pair of adjacent triangles is contained within a 6x6 bounding box.
		 * The box is defined by top-left corner which is located at input point's
		 * location.
		 * The left triangle should only use red channel, the one on the right
		 * should only use green channel.
		 * We find centroid for each triangle, sample its color and make sure
		 * it's valid.
		 */
		for (int n_point = 0; n_point < 8 /* points */; ++n_point)
		{
			const unsigned int   epsilon					   = 1;
			int					 point_x					   = 0;
			int					 point_y					   = 6 * instance_id;
			const unsigned char* rendered_data				   = NULL;
			const unsigned char* reference_data				   = 0;
			const unsigned int   row_width					   = rt_width * 4 /* components */;
			int					 t1[6 /* 3 * {x, y} */]		   = { 0 };
			int					 t2[6 /* 3 * {x, y} */]		   = { 0 };
			int					 t1_center[2 /*     {x, y} */] = { 0 };
			int					 t2_center[2 /*     {x, y} */] = { 0 };

			/* Different ordering is used for indexed draw calls */
			if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
			{
				int index = m_unordered_elements_data[n_point];

				point_x		   = 6 * index;
				reference_data = ref_data_triangle_strip + (8 - 1 - index) * 4 /* components */;
			}
			else
			{
				point_x		   = 6 * n_point;
				reference_data = ref_data_triangle_strip + n_point * 4 /* components */;
			}

			/* Calculate triangle vertex locations (corresponds to geometry shader logic) */
			t1[0] = point_x;
			t1[1] = point_y + 6;
			t1[2] = point_x;
			t1[3] = point_y;
			t1[4] = point_x + 6;
			t1[5] = point_y + 6;

			t2[0] = point_x + 6;
			t2[1] = point_y + 6;
			t2[2] = point_x;
			t2[3] = point_y;
			t2[4] = point_x + 6;
			t2[5] = point_y;

			/* Calculate centroid locations */
			t1_center[0] = (t1[0] + t1[2] + t1[4]) / 3;
			t2_center[0] = (t2[0] + t2[2] + t2[4]) / 3;
			t1_center[1] = (t1[1] + t1[3] + t1[5]) / 3;
			t2_center[1] = (t2[1] + t2[3] + t2[5]) / 3;

			/* Check the first triangle */
			point_x = t1_center[0];
			point_y = t1_center[1];

			rendered_data = data + point_y * row_width + point_x * 4 /* components */;

			if ((unsigned int)de::abs((int)rendered_data[0] - reference_data[0]) > epsilon || rendered_data[1] != 0 ||
				rendered_data[2] != 0 || rendered_data[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "At (" << (int)point_x << ", " << (int)point_y << ") "
								   << "rendered pixel (" << (int)rendered_data[0] << ", " << (int)rendered_data[1]
								   << ", " << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ") "
								   << "is different than (" << (int)reference_data[0] << ", 0, 0, 0)."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed.");
			}

			/* Check the other triangle */
			point_x = t2_center[0];
			point_y = t2_center[1];

			rendered_data = data + point_y * row_width + point_x * 4 /* components */;

			if (rendered_data[0] != 0 || (unsigned int)de::abs((int)rendered_data[1] - reference_data[1]) > epsilon ||
				rendered_data[2] != 0 || rendered_data[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "At (" << (int)point_x << ", " << (int)point_y << ") "
								   << "rendered pixel (" << (int)rendered_data[0] << ", " << (int)rendered_data[1]
								   << ", " << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ") "
								   << "is different than (0, " << (int)reference_data[1] << ", 0, 0)."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed.");
			}
		} /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:*/

	default:
	{
		TCU_FAIL("Unsupported output layout qualifier requested.");

		break;
	}
	} /* switch(m_output_type) */
}